

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O2

Book * __thiscall
Library::checkout_book(Book *__return_storage_ptr__,Library *this,Patron *patron,Book *book)

{
  bool bVar1;
  __normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_> patron_00;
  __normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_> this_00;
  double __val;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [120];
  Patron local_140;
  Date local_f8 [25];
  
  patron_00 = std::
              __find_if<__gnu_cxx::__normal_iterator<Patron*,std::vector<Patron,std::allocator<Patron>>>,__gnu_cxx::__ops::_Iter_equals_val<Patron_const>>
                        ((this->patrons).super__Vector_base<Patron,_std::allocator<Patron>_>._M_impl
                         .super__Vector_impl_data._M_start,
                         (this->patrons).super__Vector_base<Patron,_std::allocator<Patron>_>._M_impl
                         .super__Vector_impl_data._M_finish);
  if (patron_00._M_current ==
      (this->patrons).super__Vector_base<Patron,_std::allocator<Patron>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    Patron::get_name_abi_cxx11_(&local_238,patron);
    std::operator+(&bStack_258,"Error in Library::checkout_book() - Patron with name \'",&local_238)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   &bStack_258,"\' is not registered.");
    error((string *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)&bStack_258);
    std::__cxx11::string::~string((string *)&local_238);
  }
  this_00 = std::
            __find_if<__gnu_cxx::__normal_iterator<Book*,std::vector<Book,std::allocator<Book>>>,__gnu_cxx::__ops::_Iter_equals_val<Book_const>>
                      (*(undefined8 *)&this->books,*(undefined8 *)&this->field_0x20,book);
  if (this_00._M_current == *(Book **)&this->field_0x20) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    operator<<((ostream *)(local_1b8 + 0x10),book);
    Book::get_isbn_abi_cxx11_(&local_218,book);
    std::operator+(&local_238,"Error in Library::checkout_book() - Book with ISBN=",&local_218);
    std::operator+(&bStack_258,&local_238," not found.");
    error(&bStack_258);
    std::__cxx11::string::~string((string *)&bStack_258);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  bVar1 = owes_fees(patron_00._M_current);
  if (bVar1) {
    Patron::get_name_abi_cxx11_(&local_1d8,patron_00._M_current);
    std::operator+(&local_218,"Error in Library::checkout_book() - ",&local_1d8);
    std::operator+(&local_238,&local_218," owes fee: ");
    __val = Patron::get_fees(patron_00._M_current);
    std::__cxx11::to_string(&local_1f8,__val);
    std::operator+(&bStack_258,&local_238,&local_1f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   &bStack_258,"$.");
    error((string *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)&bStack_258);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  bVar1 = Book::is_checked_out(this_00._M_current);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,
               "Error in Library::checkout_book() - Requested book is already checked out.",
               (allocator<char> *)&bStack_258);
    error((string *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
  }
  Book::check_out(this_00._M_current);
  Book::Book((Book *)local_1b8,this_00._M_current);
  Patron::Patron(&local_140,patron_00._M_current);
  Date::Date(local_f8);
  std::vector<Transaction,_std::allocator<Transaction>_>::emplace_back<Transaction>
            (&this->transactions,(Transaction *)local_1b8);
  Transaction::~Transaction((Transaction *)local_1b8);
  Book::Book(__return_storage_ptr__,this_00._M_current);
  return __return_storage_ptr__;
}

Assistant:

Book Library::checkout_book(const Patron& patron, const Book& book)
{
	auto found_patron = std::find(
		patrons.begin(), patrons.end(), patron
	);
	if (found_patron == patrons.end())
		error("Error in Library::checkout_book() - Patron with name '"
			+ patron.get_name() 
			+ "' is not registered.");
	auto found_book = std::find(
		books.begin(), books.end(), book
	);
	if (found_book == books.end())
	{
		std::stringstream ss;
		ss << book;
		error("Error in Library::checkout_book() - Book with ISBN="
			+ book.get_isbn() + " not found.");
	}
	if (owes_fees(*found_patron))
		error("Error in Library::checkout_book() - "
			+ found_patron->get_name()
			+ " owes fee: "
			+ std::to_string(found_patron->get_fees())
			+ "$.");
	if (found_book->is_checked_out())
		error("Error in Library::checkout_book() - Requested book is already checked out.");
	found_book->check_out();
	transactions.push_back(Transaction{ *found_book, *found_patron, Date{} });
	return *found_book;
}